

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flags.cc
# Opt level: O1

ostream * __thiscall pstack::Flags::dump(Flags *this,ostream *os)

{
  long *plVar1;
  char *pcVar2;
  int iVar3;
  mapped_type *pmVar4;
  ostream *poVar5;
  size_t sVar6;
  option *opt;
  long *plVar7;
  char local_31;
  
  plVar7 = *(long **)this;
  plVar1 = *(long **)(this + 8);
  if (plVar7 != plVar1) {
    do {
      if (*plVar7 != 0) {
        pmVar4 = std::
                 map<int,_pstack::Flags::Data,_std::less<int>,_std::allocator<std::pair<const_int,_pstack::Flags::Data>_>_>
                 ::at((map<int,_pstack::Flags::Data,_std::less<int>,_std::allocator<std::pair<const_int,_pstack::Flags::Data>_>_>
                       *)(this + 0x18),(key_type *)(plVar7 + 3));
        std::__ostream_insert<char,std::char_traits<char>>(os,"    [",5);
        if (0 < (int)plVar7[3]) {
          std::__ostream_insert<char,std::char_traits<char>>(os,"-",1);
          local_31 = (char)plVar7[3];
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>(os,&local_31,1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"|",1);
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,"--",2);
        pcVar2 = (char *)*plVar7;
        iVar3 = (int)os;
        if (pcVar2 == (char *)0x0) {
          std::ios::clear(iVar3 + (int)*(undefined8 *)(*(long *)os + -0x18));
        }
        else {
          sVar6 = strlen(pcVar2);
          std::__ostream_insert<char,std::char_traits<char>>(os,pcVar2,sVar6);
        }
        if ((int)plVar7[1] != 0) {
          std::__ostream_insert<char,std::char_traits<char>>(os," <",2);
          pcVar2 = pmVar4->metavar;
          if (pcVar2 == (char *)0x0) {
            std::ios::clear(iVar3 + (int)*(undefined8 *)(*(long *)os + -0x18));
          }
          else {
            sVar6 = strlen(pcVar2);
            std::__ostream_insert<char,std::char_traits<char>>(os,pcVar2,sVar6);
          }
          std::__ostream_insert<char,std::char_traits<char>>(os,">",1);
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,"]\n        ",10);
        pcVar2 = pmVar4->helptext;
        if (pcVar2 == (char *)0x0) {
          std::ios::clear(iVar3 + (int)*(undefined8 *)(*(long *)os + -0x18));
        }
        else {
          sVar6 = strlen(pcVar2);
          std::__ostream_insert<char,std::char_traits<char>>(os,pcVar2,sVar6);
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
      }
      plVar7 = plVar7 + 4;
    } while (plVar7 != plVar1);
  }
  return os;
}

Assistant:

std::ostream &
Flags::dump(std::ostream &os) const
{
    for (const auto &opt  : longOptions) {
        if (opt.name == nullptr)
            continue;
        const auto &datum = data.at(opt.val);
        os << "    [";
        if (opt.val > 0)
           os << "-" << char(opt.val) << "|";
        os << "--" << opt.name;
        if (opt.has_arg != 0)
            os << " <" << datum.metavar << ">";
        os << "]\n        " << datum.helptext << "\n";
    }
    return os;
}